

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_ParseElements_addr_Test::TestBody(Descriptor_ParseElements_addr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_468;
  Message local_460;
  string local_458 [32];
  undefined1 local_438 [8];
  AssertionResult gtest_ar_1;
  Message local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  Message local_400;
  string local_3f8 [32];
  AssertHelper local_3d8;
  Message local_3d0;
  Script local_3c8;
  AssertHelper local_390;
  Message local_388 [2];
  string local_378 [367];
  allocator local_209;
  string local_208 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  allocator local_31;
  string local_30 [8];
  string descriptor;
  Descriptor_ParseElements_addr_Test *this_local;
  
  descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"addr(ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4)",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"",&local_209);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ParseElements(local_378);
      cfd::core::Descriptor::operator=
                ((Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)local_378);
      cfd::core::Descriptor::~Descriptor((Descriptor *)local_378);
    }
  }
  else {
    testing::Message::Message(local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x36f,
               "Expected: desc = Descriptor::ParseElements(descriptor) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(local_388);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript();
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_3c8);
      cfd::core::Script::~Script(&local_3c8);
    }
  }
  else {
    testing::Message::Message(&local_3d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x370,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message(&local_3d0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_(SUB81(local_3f8,0));
      std::__cxx11::string::operator=(local_208,local_3f8);
      std::__cxx11::string::~string(local_3f8);
    }
  }
  else {
    testing::Message::Message(&local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x371,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_400);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_418,"desc_str.c_str()","descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x372,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_438,"locking_script.ToString().c_str()",
             "\"0 c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201\"",pcVar2,
             "0 c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201");
  std::__cxx11::string::~string(local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x374,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::__cxx11::string::~string(local_208);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, ParseElements_addr) {
  std::string descriptor = "addr(ert1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqsflana4)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";

  EXPECT_NO_THROW(desc = Descriptor::ParseElements(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "0 c62982ba62f90e2929b8830cc3c6dc0c38fe7766d178f217f0dbbd0bf2705201");
}